

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

void __thiscall MIDIStreamer::MusicVolumeChanged(MIDIStreamer *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  uVar3 = 0xffff;
  if (this->MIDI != (MIDIDevice *)0x0) {
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
    if ((char)iVar1 != '\0') {
      fVar4 = relative_volume * snd_musicvolume.Value;
      if (1.0 <= fVar4) {
        fVar4 = 1.0;
      }
      fVar5 = 0.0;
      if (0.0 <= fVar4) {
        fVar5 = fVar4;
      }
      uVar2 = (uint)(long)(fVar5 * 65535.0);
      uVar3 = 0xffff;
      if (uVar2 < 0xffff) {
        uVar3 = uVar2;
      }
    }
  }
  this->Volume = uVar3;
  if (((this->super_MusInfo).m_Status == STATE_Playing) && (this->MIDI != (MIDIDevice *)0x0)) {
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
    if ((char)iVar1 != '\0') {
      this->NewVolume = uVar3;
      this->VolumeChanged = true;
    }
  }
  return;
}

Assistant:

void MIDIStreamer::MusicVolumeChanged()
{
	if (MIDI != NULL && MIDI->FakeVolume())
	{
		float realvolume = clamp<float>(snd_musicvolume * relative_volume, 0.f, 1.f);
		Volume = clamp<DWORD>((DWORD)(realvolume * 65535.f), 0, 65535);
	}
	else
	{
		Volume = 0xFFFF;
	}
	if (m_Status == STATE_Playing)
	{
		OutputVolume(Volume);
	}
}